

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SnippetText(Fts3Cursor *pCsr,SnippetFragment *pFragment,int iFragment,int isLast,
                   int nSnippet,char *zOpen,char *zClose,char *zEllipsis,StrBuffer *pOut)

{
  int iVar1;
  bool bVar2;
  int n;
  int isHighlight;
  int iFin;
  int iBegin;
  int DUMMY1;
  char *ZDUMMY;
  sqlite3_tokenizer_cursor *pC;
  sqlite3_tokenizer_module *pMod;
  u64 uStack_70;
  int iCol;
  u64 hlmask;
  int local_60;
  int iPos;
  int isShiftDone;
  int iEnd;
  int iCurrent;
  int nDoc;
  char *zDoc;
  Fts3Table *pFStack_40;
  int rc;
  Fts3Table *pTab;
  char *zOpen_local;
  int local_28;
  int nSnippet_local;
  int isLast_local;
  int iFragment_local;
  SnippetFragment *pFragment_local;
  Fts3Cursor *pCsr_local;
  
  pFStack_40 = (Fts3Table *)(pCsr->base).pVtab;
  isShiftDone = 0;
  iPos = 0;
  local_60 = 0;
  hlmask._4_4_ = pFragment->iPos;
  uStack_70 = pFragment->hlmask;
  pMod._4_4_ = pFragment->iCol + 1;
  pTab = (Fts3Table *)zOpen;
  zOpen_local._4_4_ = nSnippet;
  local_28 = isLast;
  nSnippet_local = iFragment;
  _isLast_local = pFragment;
  pFragment_local = (SnippetFragment *)pCsr;
  _iCurrent = sqlite3_column_text(pCsr->pStmt,pMod._4_4_);
  if (_iCurrent == (uchar *)0x0) {
    iVar1 = sqlite3_column_type((sqlite3_stmt *)pFragment_local->hlmask,pMod._4_4_);
    if (iVar1 == 5) {
      pCsr_local._4_4_ = 0;
    }
    else {
      pCsr_local._4_4_ = 7;
    }
  }
  else {
    iEnd = sqlite3_column_bytes((sqlite3_stmt *)pFragment_local->hlmask,pMod._4_4_);
    pC = (sqlite3_tokenizer_cursor *)pFStack_40->pTokenizer->pModule;
    zDoc._4_4_ = sqlite3Fts3OpenTokenizer
                           (pFStack_40->pTokenizer,(int)pFragment_local[1].covered,(char *)_iCurrent
                            ,iEnd,(sqlite3_tokenizer_cursor **)&ZDUMMY);
    pCsr_local._4_4_ = zDoc._4_4_;
    if (zDoc._4_4_ == 0) {
LAB_0020b54e:
      if (zDoc._4_4_ == 0) {
        iFin = -1;
        isHighlight = 0;
        n = 0;
        zDoc._4_4_ = (*(code *)pC[5].pTokenizer)(ZDUMMY,&iBegin,&iFin,&isHighlight,&n,&isShiftDone);
        if (zDoc._4_4_ != 0) {
          if (zDoc._4_4_ == 0x65) {
            zDoc._4_4_ = fts3StringAppend(pOut,(char *)(_iCurrent + iPos),-1);
          }
          goto LAB_0020b7a6;
        }
        if (hlmask._4_4_ <= isShiftDone) {
          if (local_60 == 0) {
            zDoc._4_4_ = fts3SnippetShift(pFStack_40,(int)pFragment_local[1].covered,
                                          zOpen_local._4_4_,(char *)(_iCurrent + isHighlight),
                                          iEnd - isHighlight,(int *)((long)&hlmask + 4),
                                          &stack0xffffffffffffff90);
            local_60 = 1;
            if (zDoc._4_4_ == 0) {
              if ((hlmask._4_4_ < 1) && (nSnippet_local < 1)) {
                if (isHighlight != 0) {
                  zDoc._4_4_ = fts3StringAppend(pOut,(char *)_iCurrent,isHighlight);
                }
              }
              else {
                zDoc._4_4_ = fts3StringAppend(pOut,zEllipsis,-1);
              }
            }
            if ((zDoc._4_4_ != 0) || (isShiftDone < hlmask._4_4_)) goto LAB_0020b54e;
          }
          if (hlmask._4_4_ + zOpen_local._4_4_ <= isShiftDone) {
            if (local_28 != 0) {
              zDoc._4_4_ = fts3StringAppend(pOut,zEllipsis,-1);
            }
            goto LAB_0020b7a6;
          }
          bVar2 = (uStack_70 & 1L << ((char)isShiftDone - (char)hlmask._4_4_ & 0x3fU)) != 0;
          if (hlmask._4_4_ < isShiftDone) {
            zDoc._4_4_ = fts3StringAppend(pOut,(char *)(_iCurrent + iPos),isHighlight - iPos);
          }
          if ((zDoc._4_4_ == 0) && (bVar2)) {
            zDoc._4_4_ = fts3StringAppend(pOut,(char *)pTab,-1);
          }
          if (zDoc._4_4_ == 0) {
            zDoc._4_4_ = fts3StringAppend(pOut,(char *)(_iCurrent + isHighlight),n - isHighlight);
          }
          if ((zDoc._4_4_ == 0) && (bVar2)) {
            zDoc._4_4_ = fts3StringAppend(pOut,zClose,-1);
          }
          iPos = n;
        }
        goto LAB_0020b54e;
      }
LAB_0020b7a6:
      (*(code *)pC[4].pTokenizer)(ZDUMMY);
      pCsr_local._4_4_ = zDoc._4_4_;
    }
  }
  return pCsr_local._4_4_;
}

Assistant:

static int fts3SnippetText(
  Fts3Cursor *pCsr,               /* FTS3 Cursor */
  SnippetFragment *pFragment,     /* Snippet to extract */
  int iFragment,                  /* Fragment number */
  int isLast,                     /* True for final fragment in snippet */
  int nSnippet,                   /* Number of tokens in extracted snippet */
  const char *zOpen,              /* String inserted before highlighted term */
  const char *zClose,             /* String inserted after highlighted term */
  const char *zEllipsis,          /* String inserted between snippets */
  StrBuffer *pOut                 /* Write output here */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc;                         /* Return code */
  const char *zDoc;               /* Document text to extract snippet from */
  int nDoc;                       /* Size of zDoc in bytes */
  int iCurrent = 0;               /* Current token number of document */
  int iEnd = 0;                   /* Byte offset of end of current token */
  int isShiftDone = 0;            /* True after snippet is shifted */
  int iPos = pFragment->iPos;     /* First token of snippet */
  u64 hlmask = pFragment->hlmask; /* Highlight-mask for snippet */
  int iCol = pFragment->iCol+1;   /* Query column to extract text from */
  sqlite3_tokenizer_module *pMod; /* Tokenizer module methods object */
  sqlite3_tokenizer_cursor *pC;   /* Tokenizer cursor open on zDoc/nDoc */
  
  zDoc = (const char *)sqlite3_column_text(pCsr->pStmt, iCol);
  if( zDoc==0 ){
    if( sqlite3_column_type(pCsr->pStmt, iCol)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }
    return SQLITE_OK;
  }
  nDoc = sqlite3_column_bytes(pCsr->pStmt, iCol);

  /* Open a token cursor on the document. */
  pMod = (sqlite3_tokenizer_module *)pTab->pTokenizer->pModule;
  rc = sqlite3Fts3OpenTokenizer(pTab->pTokenizer, pCsr->iLangid, zDoc,nDoc,&pC);
  if( rc!=SQLITE_OK ){
    return rc;
  }

  while( rc==SQLITE_OK ){
    const char *ZDUMMY;           /* Dummy argument used with tokenizer */
    int DUMMY1 = -1;              /* Dummy argument used with tokenizer */
    int iBegin = 0;               /* Offset in zDoc of start of token */
    int iFin = 0;                 /* Offset in zDoc of end of token */
    int isHighlight = 0;          /* True for highlighted terms */

    /* Variable DUMMY1 is initialized to a negative value above. Elsewhere
    ** in the FTS code the variable that the third argument to xNext points to
    ** is initialized to zero before the first (*but not necessarily
    ** subsequent*) call to xNext(). This is done for a particular application
    ** that needs to know whether or not the tokenizer is being used for
    ** snippet generation or for some other purpose.
    **
    ** Extreme care is required when writing code to depend on this
    ** initialization. It is not a documented part of the tokenizer interface.
    ** If a tokenizer is used directly by any code outside of FTS, this
    ** convention might not be respected.  */
    rc = pMod->xNext(pC, &ZDUMMY, &DUMMY1, &iBegin, &iFin, &iCurrent);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_DONE ){
        /* Special case - the last token of the snippet is also the last token
        ** of the column. Append any punctuation that occurred between the end
        ** of the previous token and the end of the document to the output. 
        ** Then break out of the loop. */
        rc = fts3StringAppend(pOut, &zDoc[iEnd], -1);
      }
      break;
    }
    if( iCurrent<iPos ){ continue; }

    if( !isShiftDone ){
      int n = nDoc - iBegin;
      rc = fts3SnippetShift(
          pTab, pCsr->iLangid, nSnippet, &zDoc[iBegin], n, &iPos, &hlmask
      );
      isShiftDone = 1;

      /* Now that the shift has been done, check if the initial "..." are
      ** required. They are required if (a) this is not the first fragment,
      ** or (b) this fragment does not begin at position 0 of its column. 
      */
      if( rc==SQLITE_OK ){
        if( iPos>0 || iFragment>0 ){
          rc = fts3StringAppend(pOut, zEllipsis, -1);
        }else if( iBegin ){
          rc = fts3StringAppend(pOut, zDoc, iBegin);
        }
      }
      if( rc!=SQLITE_OK || iCurrent<iPos ) continue;
    }

    if( iCurrent>=(iPos+nSnippet) ){
      if( isLast ){
        rc = fts3StringAppend(pOut, zEllipsis, -1);
      }
      break;
    }

    /* Set isHighlight to true if this term should be highlighted. */
    isHighlight = (hlmask & ((u64)1 << (iCurrent-iPos)))!=0;

    if( iCurrent>iPos ) rc = fts3StringAppend(pOut, &zDoc[iEnd], iBegin-iEnd);
    if( rc==SQLITE_OK && isHighlight ) rc = fts3StringAppend(pOut, zOpen, -1);
    if( rc==SQLITE_OK ) rc = fts3StringAppend(pOut, &zDoc[iBegin], iFin-iBegin);
    if( rc==SQLITE_OK && isHighlight ) rc = fts3StringAppend(pOut, zClose, -1);

    iEnd = iFin;
  }

  pMod->xClose(pC);
  return rc;
}